

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O1

void deqp::gles2::Functional::anon_unknown_0::logShader
               (TestLog *log,RenderContext *renderCtx,Shader *shader)

{
  deUint32 dVar1;
  int iVar2;
  deUint32 err;
  qpShaderType type;
  undefined4 extraout_var;
  int infoLogLen;
  int sourceLen;
  vector<char,_std::allocator<char>_> source;
  int unusedLen;
  int compileStatus;
  ShaderInfo info;
  int local_108;
  int local_104;
  vector<char,_std::allocator<char>_> local_100;
  undefined1 local_e8 [4];
  int local_e4;
  TestLog *local_e0;
  LogShader local_d8;
  string local_80;
  string local_60;
  bool local_40;
  undefined8 local_38;
  long lVar3;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_40 = false;
  local_38 = 0;
  dVar1 = shader->m_shader;
  local_e0 = log;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_40 = false;
  local_38 = 0;
  local_60._M_string_length = 0;
  *local_60._M_dataplus._M_p = '\0';
  local_e4 = 0;
  local_104 = 0;
  local_108 = 0;
  (**(code **)(lVar3 + 0xa70))(dVar1,0x8b81);
  (**(code **)(lVar3 + 0xa70))(dVar1,0x8b88,&local_104);
  (**(code **)(lVar3 + 0xa70))(dVar1,0x8b84,&local_108);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glGetShaderiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
                  ,0x95);
  local_40 = local_e4 != 0;
  if (0 < (long)local_104) {
    std::vector<char,_std::allocator<char>_>::vector
              (&local_100,(long)local_104,(allocator_type *)&local_d8);
    (**(code **)(lVar3 + 0xa68))
              (dVar1,(int)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,local_e8);
    local_d8._0_8_ = (void *)((long)&local_d8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + local_104);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_d8);
    if ((void *)local_d8._0_8_ != (void *)((long)&local_d8 + 0x10U)) {
      operator_delete((void *)local_d8._0_8_,local_d8.m_source._M_string_length + 1);
    }
    if (local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (0 < (long)local_108) {
    std::vector<char,_std::allocator<char>_>::vector
              (&local_100,(long)local_108,(allocator_type *)&local_d8);
    (**(code **)(lVar3 + 0xa58))
              (dVar1,(int)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,local_e8);
    local_d8._0_8_ = (void *)((long)&local_d8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + local_108);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_d8);
    if ((void *)local_d8._0_8_ != (void *)((long)&local_d8 + 0x10U)) {
      operator_delete((void *)local_d8._0_8_,local_d8.m_source._M_string_length + 1);
    }
    if (local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  type = glu::getLogShaderType((shader->m_info).type);
  tcu::LogShader::LogShader(&local_d8,type,&local_80,local_40,&local_60);
  tcu::TestLog::writeShader
            (local_e0,local_d8.m_type,local_d8.m_source._M_dataplus._M_p,local_d8.m_compileOk,
             local_d8.m_infoLog._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_infoLog._M_dataplus._M_p != &local_d8.m_infoLog.field_2) {
    operator_delete(local_d8.m_infoLog._M_dataplus._M_p,
                    local_d8.m_infoLog.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_source._M_dataplus._M_p != &local_d8.m_source.field_2) {
    operator_delete(local_d8.m_source._M_dataplus._M_p,
                    local_d8.m_source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void logShader (TestLog& log, glu::RenderContext& renderCtx, glu::Shader& shader)
{
	glu::ShaderInfo info;
	queryShaderInfo(renderCtx, shader.getShader(), info);

	log << TestLog::Shader(getLogShaderType(shader.getType()), info.source, info.compileOk, info.infoLog);
}